

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O2

void __thiscall kratos::HashVisitor::HashVisitor(HashVisitor *this,Generator *root)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *var;
  pointer pbVar1;
  uint64_t local_50;
  uint64_t var_hash;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vars;
  
  (this->super_IRVisitor).level = 0;
  (this->super_IRVisitor).visited_._M_h._M_buckets =
       &(this->super_IRVisitor).visited_._M_h._M_single_bucket;
  (this->super_IRVisitor).visited_._M_h._M_bucket_count = 1;
  (this->super_IRVisitor).visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_IRVisitor).visited_._M_h._M_element_count = 0;
  (this->super_IRVisitor).visited_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_IRVisitor).visited_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_IRVisitor).visited_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)&PTR_visit_root_002ab900;
  (this->var_hashes_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->var_hashes_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->var_hashes_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->stmt_hashes_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stmt_hashes_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->stmt_hashes_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->root_ = root;
  this->context_ = root->context_;
  Generator::get_vars_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&var_hash,root);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&this->var_hashes_,
             (long)((long)vars.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start - var_hash) >> 5);
  for (pbVar1 = (pointer)var_hash;
      pbVar1 != vars.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar1 = pbVar1 + 1) {
    local_50 = hash_64_fnv1a((pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length);
    std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->var_hashes_,&local_50);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&var_hash);
  return;
}

Assistant:

explicit HashVisitor(Generator* root) : root_(root) {
        context_ = root->context();
        // compute the hash for all vars
        auto vars = root->get_vars();
        var_hashes_.reserve(vars.size());
        for (const auto& var : vars) {
            uint64_t var_hash = hash_64_fnv1a(var.c_str(), var.size());
            var_hashes_.emplace_back(var_hash);
        }
    }